

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O3

unsigned_short duckdb::Cast::Operation<unsigned_char,unsigned_short>(uchar input)

{
  bool bVar1;
  InvalidInputException *this;
  uchar input_00;
  unsigned_short result;
  unsigned_short local_3a;
  string local_38;
  
  bVar1 = TryCast::Operation<unsigned_char,unsigned_short>(input,&local_3a,false);
  if (bVar1) {
    return local_3a;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  CastExceptionText<unsigned_char,unsigned_short>(&local_38,(duckdb *)(ulong)input,input_00);
  InvalidInputException::InvalidInputException(this,&local_38);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}